

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing_sse2.c
# Opt level: O3

int HasAlpha8b_SSE2(uint8_t *src,int length)

{
  uint8_t *puVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  
  uVar2 = 0;
  while ((long)(uVar2 + 0x10) <= (long)length) {
    puVar1 = src + uVar2;
    auVar3[0] = -(*puVar1 == 0xff);
    auVar3[1] = -(puVar1[1] == 0xff);
    auVar3[2] = -(puVar1[2] == 0xff);
    auVar3[3] = -(puVar1[3] == 0xff);
    auVar3[4] = -(puVar1[4] == 0xff);
    auVar3[5] = -(puVar1[5] == 0xff);
    auVar3[6] = -(puVar1[6] == 0xff);
    auVar3[7] = -(puVar1[7] == 0xff);
    auVar3[8] = -(puVar1[8] == 0xff);
    auVar3[9] = -(puVar1[9] == 0xff);
    auVar3[10] = -(puVar1[10] == 0xff);
    auVar3[0xb] = -(puVar1[0xb] == 0xff);
    auVar3[0xc] = -(puVar1[0xc] == 0xff);
    auVar3[0xd] = -(puVar1[0xd] == 0xff);
    auVar3[0xe] = -(puVar1[0xe] == 0xff);
    auVar3[0xf] = -(puVar1[0xf] == 0xff);
    uVar2 = uVar2 + 0x10;
    if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe | (ushort)(auVar3[0xf] >> 7) << 0xf)
        != 0xffff) {
      return 1;
    }
  }
  if ((int)uVar2 < length) {
    do {
      if (src[uVar2] != 0xff) {
        return 1;
      }
      uVar2 = uVar2 + 1;
    } while ((uint)length != uVar2);
    return 0;
  }
  return 0;
}

Assistant:

static int HasAlpha8b_SSE2(const uint8_t* src, int length) {
  const __m128i all_0xff = _mm_set1_epi8((char)0xff);
  int i = 0;
  for (; i + 16 <= length; i += 16) {
    const __m128i v = _mm_loadu_si128((const __m128i*)(src + i));
    const __m128i bits = _mm_cmpeq_epi8(v, all_0xff);
    const int mask = _mm_movemask_epi8(bits);
    if (mask != 0xffff) return 1;
  }
  for (; i < length; ++i) if (src[i] != 0xff) return 1;
  return 0;
}